

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

PVIPNode * PVIP_parse_string(pvip_t *pvip,char *string,int len,int debug,PVIPString **error)

{
  byte c;
  int iVar1;
  size_t len_00;
  PVIPString *pPVar2;
  size_t sVar3;
  PVIPNode *pPVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  GREG local_d0;
  
  memset(&local_d0,0,0xa0);
  local_d0.data.line_number = 1;
  local_d0.data.line_number_stack = (int *)0x0;
  local_d0.data.line_number_stack_size = 0;
  local_d0.data.is_string = 1;
  local_d0.data.str = (PVIPParserStringState *)malloc(0x18);
  (local_d0.data.str)->buf = string;
  (local_d0.data.str)->len = (long)len;
  (local_d0.data.str)->pos = 0;
  local_d0.data.pvip = pvip;
  iVar1 = PVIP_parse_from(&local_d0,yy_comp_init);
  if (iVar1 == 0) {
    if (error != (PVIPString **)0x0) {
      pPVar2 = PVIP_string_new();
      *error = pPVar2;
      PVIP_string_concat(pPVar2,"** Syntax error at line ",0x18);
      PVIP_string_concat_int(*error,(long)local_d0.data.line_number);
      PVIP_string_concat(*error,"\n",1);
      if (*local_d0.text != '\0') {
        PVIP_string_concat(*error,"** near ",8);
        pPVar2 = *error;
        len_00 = strlen(local_d0.text);
        PVIP_string_concat(pPVar2,local_d0.text,len_00);
      }
      if ((local_d0.pos < local_d0.limit) || ((local_d0.data.str)->len == (local_d0.data.str)->pos))
      {
        local_d0.buf[local_d0.limit] = '\0';
        PVIP_string_concat(*error," before text \"",0xe);
        while (local_d0.pos < local_d0.limit) {
          lVar5 = (long)local_d0.pos;
          if ((local_d0.buf[lVar5] == '\n') || (local_d0.buf[lVar5] == '\r')) break;
          local_d0.pos = local_d0.pos + 1;
          PVIP_string_concat_char(*error,local_d0.buf[lVar5]);
        }
        if ((local_d0.pos == local_d0.limit) &&
           (sVar3 = (local_d0.data.str)->pos, (local_d0.data.str)->len != sVar3)) {
          do {
            (local_d0.data.str)->pos = sVar3 + 1;
            c = (local_d0.data.str)->buf[sVar3];
            if ((c < 0xe) && ((0x2401U >> (c & 0x1f) & 1) != 0)) break;
            PVIP_string_concat_char(*error,c);
            sVar3 = (local_d0.data.str)->pos;
          } while ((local_d0.data.str)->len != sVar3);
        }
        PVIP_string_concat_char(*error,'\"');
      }
      PVIP_string_concat(*error,"\n\n",2);
      free(local_d0.data.str);
    }
  }
  else {
    pPVar4 = local_d0.data.root;
    if (local_d0.limit == local_d0.pos) goto LAB_00103b08;
    if (error != (PVIPString **)0x0) {
      pPVar2 = PVIP_string_new();
      *error = pPVar2;
      PVIP_string_concat(pPVar2,"Syntax error! Around:\n",0x16);
      iVar1 = local_d0.limit;
      uVar6 = 0;
      if (local_d0.limit != local_d0.pos) {
        do {
          lVar5 = (long)local_d0.pos;
          local_d0.pos = local_d0.pos + 1;
          if ((local_d0.data.str)->buf[lVar5] != '\0') {
            PVIP_string_concat_char(*error,(local_d0.data.str)->buf[lVar5]);
            iVar1 = local_d0.limit;
          }
        } while ((iVar1 != local_d0.pos) && (bVar7 = uVar6 < 0x17, uVar6 = uVar6 + 1, bVar7));
      }
      PVIP_string_concat_char(*error,'\n');
    }
  }
  pPVar4 = (PVIPNode *)0x0;
LAB_00103b08:
  free(local_d0.data.line_number_stack);
  free(local_d0.data.str);
  if (local_d0.data.root == (PVIPNode *)0x0) {
    __assert_fail("g.data.root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/build_O3/gen.pvip.y.c"
                  ,0x2c28,
                  "PVIPNode *PVIP_parse_string(pvip_t *, const char *, int, int, PVIPString **)");
  }
  PVIP_deinit(&local_d0);
  return pPVar4;
}

Assistant:

PVIPNode * PVIP_parse_string(pvip_t* pvip, const char *string, int len, int debug, PVIPString **error) {
    PVIPNode *root = NULL;

    GREG g;
    YY_NAME(init)(&g);

#ifdef YY_DEBUG
    g.debug=debug;
#endif

    g.data.line_number = 1;
    g.data.line_number_stack_size = 0;
    g.data.line_number_stack = NULL;
    g.data.is_string   = 1;
    g.data.str = malloc(sizeof(PVIPParserStringState));
    g.data.str->buf     = string;
    g.data.str->len     = len;
    g.data.str->pos     = 0;
    g.data.pvip = pvip;

    if (!YY_NAME(parse)(&g)) {
      if (error) {
        *error = PVIP_string_new();
        PVIP_string_concat(*error, "** Syntax error at line ", strlen("** Syntax error at line "));
        PVIP_string_concat_int(*error, g.data.line_number);
        PVIP_string_concat(*error, "\n", 1);
        if (g.text[0]) {
            PVIP_string_concat(*error, "** near ", strlen("** near "));
            PVIP_string_concat(*error, g.text, strlen(g.text));
        }
        if (g.pos < g.limit || g.data.str->len==g.data.str->pos) {
            g.buf[g.limit]= '\0';
            PVIP_string_concat(*error, " before text \"", strlen(" before text \""));
            while (g.pos < g.limit) {
                if ('\n' == g.buf[g.pos] || '\r' == g.buf[g.pos]) break;
                PVIP_string_concat_char(*error, g.buf[g.pos++]);
            }
            if (g.pos == g.limit) {
                while (g.data.str->len!=g.data.str->pos) {
                    char ch = g.data.str->buf[g.data.str->pos++];
                    if (!ch || '\n' == ch || '\r' == ch) {
                        break;
                    }
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\"');
        }
        PVIP_string_concat(*error, "\n\n", 2);
        free(g.data.str);
      }
      goto finished;
    }
    if (g.limit!=g.pos) {
        if (error) {
            *error = PVIP_string_new();
            PVIP_string_concat(*error, "Syntax error! Around:\n", strlen("Syntax error! Around:\n"));
            int i;
            for (i=0; g.limit!=g.pos && i<24; i++) {
                char ch = g.data.str->buf[g.pos++];
                if (ch) {
                    PVIP_string_concat_char(*error, ch);
                }
            }
            PVIP_string_concat_char(*error, '\n');
        }
        goto finished;
    }
    root = g.data.root;

finished:

    free(g.data.line_number_stack);
    free(g.data.str);
    assert(g.data.root);
    YY_NAME(deinit)(&g);
    return root;
}